

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O1

void __thiscall
viennamath::rt_latex_translator<viennamath::rt_expression_interface<double>_>::~rt_latex_translator
          (rt_latex_translator<viennamath::rt_expression_interface<double>_> *this)

{
  pointer pprVar1;
  
  pprVar1 = (this->processors_).
            super__Vector_base<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pprVar1 !=
      (this->processors_).
      super__Vector_base<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (*pprVar1 !=
          (rt_latex_processor_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
        (*(*pprVar1)->_vptr_rt_latex_processor_interface[4])();
      }
      pprVar1 = pprVar1 + 1;
    } while (pprVar1 !=
             (this->processors_).
             super__Vector_base<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pprVar1 = (this->processors_).
            super__Vector_base<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pprVar1 != (pointer)0x0) {
    operator_delete(pprVar1,(long)(this->processors_).
                                  super__Vector_base<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pprVar1
                   );
    return;
  }
  return;
}

Assistant:

~rt_latex_translator()
      {
        for (typename ProcessorArray::iterator it = processors_.begin();
                                               it != processors_.end();
                                             ++it)
        {
          delete *it;
        }
      }